

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O3

void Wlc_WriteNdr(Wlc_Ntk_t *pNtk,char *pFileName)

{
  void *__ptr;
  FILE *__s;
  Ndr_Data_t *p;
  
  __ptr = Wlc_NtkToNdr(pNtk);
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    if (__ptr == (void *)0x0) goto LAB_003644b8;
  }
  else {
    fwrite(*(uint **)((long)__ptr + 0x10),4,(ulong)**(uint **)((long)__ptr + 0x10),__s);
    fwrite(*(void **)((long)__ptr + 8),1,(ulong)**(uint **)((long)__ptr + 0x10),__s);
    fclose(__s);
  }
  free(*(void **)((long)__ptr + 8));
  free(*(void **)((long)__ptr + 0x10));
  free(__ptr);
LAB_003644b8:
  printf("Dumped the current design into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Wlc_WriteNdr( Wlc_Ntk_t * pNtk, char * pFileName )
{
    void * pDesign = Wlc_NtkToNdr( pNtk );
    Ndr_Write( pFileName, pDesign );
    Ndr_Delete( pDesign );
    printf( "Dumped the current design into file \"%s\".\n", pFileName );
}